

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  long lVar282;
  ulong uVar283;
  ulong uVar284;
  long lVar285;
  uint64_t *puVar286;
  ulong uVar287;
  ulong uVar288;
  ulong uVar289;
  ulong uVar290;
  ulong uVar291;
  uint64_t *puVar292;
  ulong uVar293;
  ulong uVar294;
  ulong uVar295;
  ulong uVar296;
  ulong uVar297;
  ulong local_d8;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_98;
  
  if (len != 0) {
    secp256k1_fe_impl_normalize_weak(&a[len - 1].y);
    lVar282 = len - 1;
    if (lVar282 != 0) {
      local_c0 = zr[lVar282].n[4];
      local_b8 = zr[lVar282].n[3];
      local_c8 = zr[lVar282].n[2];
      local_d8 = zr[lVar282].n[0];
      local_98 = zr[lVar282].n[1];
      puVar286 = a[len - 2].y.n + 4;
      puVar292 = zr[len - 1].n + 4;
      lVar285 = 0;
      do {
        if (lVar285 != 0) {
          uVar289 = puVar292[-1];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar289;
          auVar149._8_8_ = 0;
          auVar149._0_8_ = local_d8;
          uVar1 = puVar292[-2];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar1;
          auVar150._8_8_ = 0;
          auVar150._0_8_ = local_98;
          uVar293 = puVar292[-3];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar293;
          auVar151._8_8_ = 0;
          auVar151._0_8_ = local_c8;
          uVar2 = ((secp256k1_fe *)(puVar292 + -4))->n[0];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar2;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = local_b8;
          uVar3 = *puVar292;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar3;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = local_c0;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = SUB168(auVar8 * auVar153,0);
          auVar7 = auVar5 * auVar150 + auVar4 * auVar149 + auVar6 * auVar151 + auVar7 * auVar152 +
                   auVar9 * ZEXT816(0x1000003d10);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar3;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = local_d8;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar289;
          auVar155._8_8_ = 0;
          auVar155._0_8_ = local_98;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar1;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = local_c8;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar293;
          auVar157._8_8_ = 0;
          auVar157._0_8_ = local_b8;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar2;
          auVar158._8_8_ = 0;
          auVar158._0_8_ = local_c0;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = SUB168(auVar8 * auVar153,8);
          auVar4 = auVar15 * ZEXT816(0x1000003d10000) +
                   auVar14 * auVar158 + auVar13 * auVar157 + auVar12 * auVar156 + auVar11 * auVar155
                   + auVar10 * auVar154 + (auVar7 >> 0x34);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar2;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = local_d8;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar3;
          auVar160._8_8_ = 0;
          auVar160._0_8_ = local_98;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar289;
          auVar161._8_8_ = 0;
          auVar161._0_8_ = local_c8;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar1;
          auVar162._8_8_ = 0;
          auVar162._0_8_ = local_b8;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar293;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = local_c0;
          auVar5 = auVar20 * auVar163 + auVar19 * auVar162 + auVar18 * auVar161 + auVar17 * auVar160
                   + (auVar4 >> 0x34);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
          auVar6 = auVar16 * auVar159 + auVar21 * ZEXT816(0x1000003d1);
          uVar283 = auVar6._0_8_;
          uVar288 = auVar6._8_8_;
          auVar264._8_8_ = uVar288 >> 0x34;
          auVar264._0_8_ = uVar288 * 0x1000 | uVar283 >> 0x34;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar293;
          auVar164._8_8_ = 0;
          auVar164._0_8_ = local_d8;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar2;
          auVar165._8_8_ = 0;
          auVar165._0_8_ = local_98;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar3;
          auVar166._8_8_ = 0;
          auVar166._0_8_ = local_c8;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar289;
          auVar167._8_8_ = 0;
          auVar167._0_8_ = local_b8;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar1;
          auVar168._8_8_ = 0;
          auVar168._0_8_ = local_c0;
          auVar5 = auVar24 * auVar166 + auVar26 * auVar168 + auVar25 * auVar167 + (auVar5 >> 0x34);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
          auVar264 = auVar27 * ZEXT816(0x1000003d10) + auVar22 * auVar164 + auVar23 * auVar165 +
                     auVar264;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar1;
          auVar169._8_8_ = 0;
          auVar169._0_8_ = local_d8;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar293;
          auVar170._8_8_ = 0;
          auVar170._0_8_ = local_98;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar2;
          auVar171._8_8_ = 0;
          auVar171._0_8_ = local_c8;
          local_98 = auVar264._0_8_ & 0xfffffffffffff;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar3;
          auVar172._8_8_ = 0;
          auVar172._0_8_ = local_b8;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar289;
          auVar173._8_8_ = 0;
          auVar173._0_8_ = local_c0;
          auVar5 = auVar32 * auVar173 + auVar31 * auVar172 + (auVar5 >> 0x34);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = auVar5._0_8_;
          auVar6 = auVar33 * ZEXT816(0x1000003d10) +
                   auVar30 * auVar171 + auVar28 * auVar169 + auVar29 * auVar170 + (auVar264 >> 0x34)
          ;
          auVar8 = auVar6 >> 0x34;
          auVar270._8_8_ = 0;
          auVar270._0_8_ = auVar8._0_8_;
          local_c8 = auVar6._0_8_ & 0xfffffffffffff;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar5._8_8_;
          auVar269._8_8_ = auVar8._8_8_;
          auVar269._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
          auVar270 = auVar34 * ZEXT816(0x1000003d10000) + auVar269 + auVar270;
          uVar289 = auVar270._0_8_;
          local_c0 = (auVar270._8_8_ << 0xc | uVar289 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
          local_b8 = uVar289 & 0xfffffffffffff;
          local_d8 = uVar283 & 0xfffffffffffff;
        }
        uVar1 = local_d8 * 2;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar1;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = local_b8;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_98 * 2;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = local_c8;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = local_c0;
        auVar176._8_8_ = 0;
        auVar176._0_8_ = local_c0;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = SUB168(auVar37 * auVar176,0);
        auVar4 = auVar38 * ZEXT816(0x1000003d10) + auVar36 * auVar175 + auVar35 * auVar174;
        uVar289 = local_c0 * 2;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_d8;
        auVar177._8_8_ = 0;
        auVar177._0_8_ = uVar289;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_98 * 2;
        auVar178._8_8_ = 0;
        auVar178._0_8_ = local_b8;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_c8;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = local_c8;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = SUB168(auVar37 * auVar176,8);
        auVar5 = auVar40 * auVar178 + auVar42 * ZEXT816(0x1000003d10000) + auVar41 * auVar179 +
                 auVar39 * auVar177 + (auVar4 >> 0x34);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_d8;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = local_d8;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = local_98;
        auVar181._8_8_ = 0;
        auVar181._0_8_ = uVar289;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_c8 * 2;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = local_b8;
        auVar6 = auVar45 * auVar182 + auVar44 * auVar181 + (auVar5 >> 0x34);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
        auVar7 = auVar46 * ZEXT816(0x1000003d1) + auVar43 * auVar180;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar1;
        auVar183._8_8_ = 0;
        auVar183._0_8_ = local_98;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_c8;
        auVar184._8_8_ = 0;
        auVar184._0_8_ = uVar289;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = local_b8;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = local_b8;
        auVar6 = auVar49 * auVar185 + auVar48 * auVar184 + (auVar6 >> 0x34);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
        auVar8 = (auVar7 >> 0x34) + auVar47 * auVar183 + auVar50 * ZEXT816(0x1000003d10);
        uVar290 = auVar8._0_8_;
        uVar293 = auVar8._8_8_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar1;
        auVar186._8_8_ = 0;
        auVar186._0_8_ = local_c8;
        auVar271._8_8_ = uVar293 >> 0x34;
        auVar271._0_8_ = uVar293 * 0x1000 | uVar290 >> 0x34;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = local_98;
        auVar187._8_8_ = 0;
        auVar187._0_8_ = local_98;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar289;
        auVar188._8_8_ = 0;
        auVar188._0_8_ = local_b8;
        auVar6 = auVar53 * auVar188 + (auVar6 >> 0x34);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = auVar6._0_8_;
        auVar271 = auVar54 * ZEXT816(0x1000003d10) + auVar52 * auVar187 + auVar51 * auVar186 +
                   auVar271;
        auVar8 = auVar271 >> 0x34;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = auVar8._0_8_;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = auVar6._8_8_;
        auVar272._8_8_ = auVar8._8_8_;
        auVar272._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
        auVar273 = auVar55 * ZEXT816(0x1000003d10000) + auVar272 + auVar273;
        uVar294 = auVar273._0_8_;
        uVar296 = auVar7._0_8_ & 0xfffffffffffff;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar296;
        auVar189._8_8_ = 0;
        auVar189._0_8_ = local_b8;
        uVar287 = (auVar273._8_8_ << 0xc | uVar294 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
        uVar290 = uVar290 & 0xfffffffffffff;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar290;
        auVar190._8_8_ = 0;
        auVar190._0_8_ = local_c8;
        uVar297 = auVar271._0_8_ & 0xfffffffffffff;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar297;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = local_98;
        uVar294 = uVar294 & 0xfffffffffffff;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar294;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = local_d8;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar287;
        auVar193._8_8_ = 0;
        auVar193._0_8_ = local_c0;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = SUB168(auVar60 * auVar193,0);
        auVar4 = auVar61 * ZEXT816(0x1000003d10) +
                 auVar57 * auVar190 + auVar56 * auVar189 + auVar58 * auVar191 + auVar59 * auVar192;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar296;
        auVar194._8_8_ = 0;
        auVar194._0_8_ = local_c0;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar290;
        auVar195._8_8_ = 0;
        auVar195._0_8_ = local_b8;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar297;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = local_c8;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar294;
        auVar197._8_8_ = 0;
        auVar197._0_8_ = local_98;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar287;
        auVar198._8_8_ = 0;
        auVar198._0_8_ = local_d8;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = SUB168(auVar60 * auVar193,8);
        auVar5 = auVar67 * ZEXT816(0x1000003d10000) +
                 auVar66 * auVar198 +
                 auVar65 * auVar197 + auVar64 * auVar196 + auVar62 * auVar194 + auVar63 * auVar195 +
                 (auVar4 >> 0x34);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar296;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = local_d8;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar290;
        auVar200._8_8_ = 0;
        auVar200._0_8_ = local_c0;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar297;
        auVar201._8_8_ = 0;
        auVar201._0_8_ = local_b8;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar294;
        auVar202._8_8_ = 0;
        auVar202._0_8_ = local_c8;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar287;
        auVar203._8_8_ = 0;
        auVar203._0_8_ = local_98;
        auVar6 = auVar72 * auVar203 + auVar69 * auVar200 + auVar70 * auVar201 + auVar71 * auVar202 +
                 (auVar5 >> 0x34);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
        auVar7 = auVar68 * auVar199 + auVar73 * ZEXT816(0x1000003d1);
        uVar284 = auVar7._0_8_;
        uVar289 = auVar7._8_8_;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uVar296;
        auVar204._8_8_ = 0;
        auVar204._0_8_ = local_98;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar290;
        auVar205._8_8_ = 0;
        auVar205._0_8_ = local_d8;
        auVar265._8_8_ = uVar289 >> 0x34;
        auVar265._0_8_ = uVar289 * 0x1000 | uVar284 >> 0x34;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar297;
        auVar206._8_8_ = 0;
        auVar206._0_8_ = local_c0;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar294;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = local_b8;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar287;
        auVar208._8_8_ = 0;
        auVar208._0_8_ = local_c8;
        auVar6 = auVar78 * auVar208 + auVar77 * auVar207 + auVar76 * auVar206 + (auVar6 >> 0x34);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
        auVar265 = auVar79 * ZEXT816(0x1000003d10) + auVar74 * auVar204 + auVar75 * auVar205 +
                   auVar265;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar296;
        auVar209._8_8_ = 0;
        auVar209._0_8_ = local_c8;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar290;
        auVar210._8_8_ = 0;
        auVar210._0_8_ = local_98;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar297;
        auVar211._8_8_ = 0;
        auVar211._0_8_ = local_d8;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar294;
        auVar212._8_8_ = 0;
        auVar212._0_8_ = local_c0;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar287;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = local_b8;
        auVar6 = auVar84 * auVar213 + auVar83 * auVar212 + (auVar6 >> 0x34);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = auVar6._0_8_;
        auVar7 = auVar85 * ZEXT816(0x1000003d10) +
                 auVar82 * auVar211 + auVar81 * auVar210 + auVar80 * auVar209 + (auVar265 >> 0x34);
        auVar8 = auVar7 >> 0x34;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = auVar8._0_8_;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = auVar6._8_8_;
        auVar274._8_8_ = auVar8._8_8_;
        auVar274._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        auVar275 = auVar86 * ZEXT816(0x1000003d10000) + auVar274 + auVar275;
        uVar288 = auVar275._0_8_;
        uVar289 = puVar286[-9];
        uVar1 = puVar286[-8];
        auVar87._8_8_ = 0;
        auVar87._0_8_ = uVar294;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = uVar289;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar297;
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar1;
        uVar293 = puVar286[-7];
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar290;
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar293;
        uVar2 = puVar286[-6];
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar296;
        auVar217._8_8_ = 0;
        auVar217._0_8_ = uVar2;
        uVar3 = puVar286[-5];
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar287;
        auVar218._8_8_ = 0;
        auVar218._0_8_ = uVar3;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = SUB168(auVar91 * auVar218,0);
        uVar291 = (auVar275._8_8_ << 0xc | uVar288 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
        auVar4 = auVar92 * ZEXT816(0x1000003d10) +
                 auVar88 * auVar215 + auVar90 * auVar217 + auVar89 * auVar216 + auVar87 * auVar214;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar287;
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar289;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar294;
        auVar220._8_8_ = 0;
        auVar220._0_8_ = uVar1;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar297;
        auVar221._8_8_ = 0;
        auVar221._0_8_ = uVar293;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar290;
        auVar222._8_8_ = 0;
        auVar222._0_8_ = uVar2;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar296;
        auVar223._8_8_ = 0;
        auVar223._0_8_ = uVar3;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = SUB168(auVar91 * auVar218,8);
        auVar5 = auVar98 * ZEXT816(0x1000003d10000) +
                 auVar94 * auVar220 + auVar95 * auVar221 + auVar97 * auVar223 + auVar96 * auVar222 +
                 auVar93 * auVar219 + (auVar4 >> 0x34);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar296;
        auVar224._8_8_ = 0;
        auVar224._0_8_ = uVar289;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar287;
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar1;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar294;
        auVar226._8_8_ = 0;
        auVar226._0_8_ = uVar293;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar297;
        auVar227._8_8_ = 0;
        auVar227._0_8_ = uVar2;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar290;
        auVar228._8_8_ = 0;
        auVar228._0_8_ = uVar3;
        auVar6 = (auVar5 >> 0x34) +
                 auVar101 * auVar226 + auVar103 * auVar228 + auVar102 * auVar227 +
                 auVar100 * auVar225;
        uVar283 = auVar6._0_8_;
        uVar295 = auVar6._8_8_;
        auVar276._8_8_ = uVar295 >> 0x34;
        auVar276._0_8_ = uVar295 * 0x1000 | uVar283 >> 0x34;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar283 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
        auVar6 = auVar104 * ZEXT816(0x1000003d1) + auVar99 * auVar224;
        uVar283 = auVar6._0_8_;
        uVar295 = auVar6._8_8_;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar290;
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar289;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar296;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = uVar1;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar287;
        auVar231._8_8_ = 0;
        auVar231._0_8_ = uVar293;
        auVar266._8_8_ = uVar295 >> 0x34;
        auVar266._0_8_ = uVar295 * 0x1000 | uVar283 >> 0x34;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar294;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = uVar2;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar297;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = uVar3;
        auVar276 = auVar107 * auVar231 + auVar109 * auVar233 + auVar108 * auVar232 + auVar276;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = auVar276._0_8_ & 0xfffffffffffff;
        auVar266 = auVar110 * ZEXT816(0x1000003d10) + auVar106 * auVar230 + auVar105 * auVar229 +
                   auVar266;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar297;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = uVar289;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar290;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = uVar1;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar296;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar293;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar287;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = uVar2;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar294;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = uVar3;
        auVar6 = auVar115 * auVar238 + auVar114 * auVar237 + (auVar276 >> 0x34);
        auVar116._8_8_ = 0;
        auVar116._0_8_ = auVar6._0_8_;
        puVar286[-9] = uVar283 & 0xfffffffffffff;
        auVar8 = auVar116 * ZEXT816(0x1000003d10) +
                 auVar111 * auVar234 + auVar112 * auVar235 + auVar113 * auVar236 +
                 (auVar266 >> 0x34);
        puVar286[-8] = auVar266._0_8_ & 0xfffffffffffff;
        auVar9 = auVar8 >> 0x34;
        auVar278._8_8_ = 0;
        auVar278._0_8_ = auVar9._0_8_;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = auVar6._8_8_;
        auVar277._8_8_ = auVar9._8_8_;
        auVar277._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        puVar286[-7] = auVar8._0_8_ & 0xfffffffffffff;
        auVar278 = auVar117 * ZEXT816(0x1000003d10000) + auVar277 + auVar278;
        uVar289 = auVar278._0_8_;
        puVar286[-6] = uVar289 & 0xfffffffffffff;
        puVar286[-5] = (auVar278._8_8_ << 0xc | uVar289 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
        uVar289 = ((secp256k1_fe *)(puVar286 + -4))->n[0];
        uVar1 = puVar286[-3];
        uVar293 = puVar286[-2];
        uVar2 = puVar286[-1];
        uVar288 = uVar288 & 0xfffffffffffff;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar288;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = uVar289;
        uVar283 = auVar7._0_8_ & 0xfffffffffffff;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar283;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = uVar1;
        uVar294 = auVar265._0_8_ & 0xfffffffffffff;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar294;
        auVar241._8_8_ = 0;
        auVar241._0_8_ = uVar293;
        uVar284 = uVar284 & 0xfffffffffffff;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar284;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = uVar2;
        uVar3 = *puVar286;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar291;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = uVar3;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = SUB168(auVar122 * auVar243,0);
        auVar4 = auVar123 * ZEXT816(0x1000003d10) +
                 auVar118 * auVar239 +
                 auVar119 * auVar240 + auVar121 * auVar242 + auVar120 * auVar241;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar291;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = uVar289;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar288;
        auVar245._8_8_ = 0;
        auVar245._0_8_ = uVar1;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar283;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = uVar293;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar294;
        auVar247._8_8_ = 0;
        auVar247._0_8_ = uVar2;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = uVar284;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = uVar3;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = SUB168(auVar122 * auVar243,8);
        auVar5 = auVar129 * ZEXT816(0x1000003d10000) +
                 auVar124 * auVar244 +
                 auVar125 * auVar245 +
                 auVar126 * auVar246 + auVar128 * auVar248 + auVar127 * auVar247 + (auVar4 >> 0x34);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar284;
        auVar249._8_8_ = 0;
        auVar249._0_8_ = uVar289;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = uVar291;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = uVar1;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar288;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = uVar293;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = uVar283;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = uVar2;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = uVar294;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = uVar3;
        auVar6 = (auVar5 >> 0x34) +
                 auVar131 * auVar250 +
                 auVar132 * auVar251 + auVar134 * auVar253 + auVar133 * auVar252;
        uVar287 = auVar6._0_8_;
        uVar290 = auVar6._8_8_;
        auVar281._8_8_ = uVar290 >> 0x34;
        auVar281._0_8_ = uVar290 * 0x1000 | uVar287 >> 0x34;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = uVar287 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
        auVar6 = auVar130 * auVar249 + auVar135 * ZEXT816(0x1000003d1);
        uVar287 = auVar6._0_8_;
        uVar290 = auVar6._8_8_;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = uVar294;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = uVar289;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = uVar284;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = uVar1;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = uVar291;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = uVar293;
        auVar267._8_8_ = uVar290 >> 0x34;
        auVar267._0_8_ = uVar290 * 0x1000 | uVar287 >> 0x34;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar288;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = uVar2;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = uVar283;
        auVar258._8_8_ = 0;
        auVar258._0_8_ = uVar3;
        auVar281 = auVar138 * auVar256 + auVar140 * auVar258 + auVar139 * auVar257 + auVar281;
        uVar295 = auVar281._0_8_;
        uVar290 = auVar281._8_8_;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = uVar295 & 0xfffffffffffff;
        auVar267 = auVar141 * ZEXT816(0x1000003d10) + auVar136 * auVar254 + auVar137 * auVar255 +
                   auVar267;
        auVar268._8_8_ = uVar290 >> 0x34;
        auVar268._0_8_ = uVar290 * 0x1000 | uVar295 >> 0x34;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar283;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = uVar289;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = uVar294;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = uVar1;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = uVar284;
        auVar261._8_8_ = 0;
        auVar261._0_8_ = uVar293;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = uVar291;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = uVar2;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar288;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = uVar3;
        auVar268 = auVar146 * auVar263 + auVar145 * auVar262 + auVar268;
        ((secp256k1_fe *)(puVar286 + -4))->n[0] = uVar287 & 0xfffffffffffff;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = auVar268._0_8_;
        puVar286[-3] = auVar267._0_8_ & 0xfffffffffffff;
        auVar6 = auVar147 * ZEXT816(0x1000003d10) +
                 auVar142 * auVar259 + auVar144 * auVar261 + auVar143 * auVar260 +
                 (auVar267 >> 0x34);
        auVar7 = auVar6 >> 0x34;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = auVar7._0_8_;
        puVar286[-2] = auVar6._0_8_ & 0xfffffffffffff;
        auVar148._8_8_ = 0;
        auVar148._0_8_ = auVar268._8_8_;
        auVar279._8_8_ = auVar7._8_8_;
        auVar279._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        auVar280 = auVar148 * ZEXT816(0x1000003d10000) + auVar279 + auVar280;
        uVar289 = auVar280._0_8_;
        puVar286[-1] = uVar289 & 0xfffffffffffff;
        *puVar286 = (auVar280._8_8_ << 0xc | uVar289 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
        lVar285 = lVar285 + 1;
        puVar286 = puVar286 + -0xb;
        puVar292 = puVar292 + -5;
      } while (lVar282 != lVar285);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}